

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satVec.h
# Opt level: O2

void veci_push(veci *v,int e)

{
  uint uVar1;
  int *piVar2;
  int iVar3;
  
  uVar1 = v->size;
  if (uVar1 == v->cap) {
    iVar3 = (uVar1 >> 1) * 3;
    if ((int)uVar1 < 4) {
      iVar3 = uVar1 * 2;
    }
    if (v->ptr == (int *)0x0) {
      piVar2 = (int *)malloc((long)iVar3 << 2);
    }
    else {
      piVar2 = (int *)realloc(v->ptr,(long)iVar3 << 2);
    }
    v->ptr = piVar2;
    if (piVar2 == (int *)0x0) {
      printf("Failed to realloc memory from %.1f MB to %.1f MB.\n",
             (double)v->cap * 9.5367431640625e-07,(double)iVar3 * 9.5367431640625e-07);
      fflush(_stdout);
    }
    v->cap = iVar3;
    uVar1 = v->size;
  }
  v->size = uVar1 + 1;
  v->ptr[(int)uVar1] = e;
  return;
}

Assistant:

static inline void   veci_push   (veci* v, int e)
{
    if (v->size == v->cap) {
//        int newsize = v->cap * 2;//+1;
        int newsize = (v->cap < 4) ? v->cap * 2 : (v->cap / 2) * 3;
        v->ptr = ABC_REALLOC( int, v->ptr, newsize );
        if ( v->ptr == NULL )
        {
            printf( "Failed to realloc memory from %.1f MB to %.1f MB.\n", 
                1.0 * v->cap / (1<<20), 1.0 * newsize / (1<<20) );
            fflush( stdout );
        }
        v->cap = newsize; }
    v->ptr[v->size++] = e;
}